

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O1

DistanceEntry * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDistanceEntryForSubscriptPair
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair,
          DistanceVector *distance_vector)

{
  pointer ppLVar1;
  Loop *pLVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pLVar2 = GetLoopForSubscriptPair(this,subscript_pair);
  if (pLVar2 != (Loop *)0x0) {
    ppLVar1 = (this->loops_).
              super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->loops_).
                  super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1;
    if (lVar3 != 0) {
      lVar3 = lVar3 >> 3;
      lVar4 = 0;
      lVar5 = 0;
      do {
        if (ppLVar1[lVar5] == pLVar2) {
          return (DistanceEntry *)
                 ((long)(distance_vector->entries).
                        super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start - lVar4);
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + -0x28;
      } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
      return (DistanceEntry *)0x0;
    }
  }
  return (DistanceEntry *)0x0;
}

Assistant:

DistanceEntry* LoopDependenceAnalysis::GetDistanceEntryForSubscriptPair(
    const std::pair<SENode*, SENode*>& subscript_pair,
    DistanceVector* distance_vector) {
  const Loop* loop = GetLoopForSubscriptPair(subscript_pair);

  return GetDistanceEntryForLoop(loop, distance_vector);
}